

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp_socket.cc
# Opt level: O2

void __thiscall UdpSocket::UdpSocket(UdpSocket *this,uint16_t port)

{
  timeval *ptVar1;
  pointer __p;
  pointer __p_00;
  pointer __p_01;
  
  this->_port = port;
  (this->_read_time)._M_t.super___uniq_ptr_impl<timeval,_std::default_delete<timeval>_>._M_t.
  super__Tuple_impl<0UL,_timeval_*,_std::default_delete<timeval>_>.
  super__Head_base<0UL,_timeval_*,_false>._M_head_impl = (timeval *)0x0;
  (this->_readset)._M_t.super___uniq_ptr_impl<fd_set,_std::default_delete<fd_set>_>._M_t.
  super__Tuple_impl<0UL,_fd_set_*,_std::default_delete<fd_set>_>.
  super__Head_base<0UL,_fd_set_*,_false>._M_head_impl = (fd_set *)0x0;
  (this->_read_addr)._M_t.super___uniq_ptr_impl<sockaddr_in,_std::default_delete<sockaddr_in>_>._M_t
  .super__Tuple_impl<0UL,_sockaddr_in_*,_std::default_delete<sockaddr_in>_>.
  super__Head_base<0UL,_sockaddr_in_*,_false>._M_head_impl = (sockaddr_in *)0x0;
  this->_recv_speed_bytes = 0;
  this->_print_time_ms = 0;
  this->_prior_recv_time = 0;
  InitSocket(this);
  __p = (pointer)operator_new(0x10);
  std::__uniq_ptr_impl<timeval,_std::default_delete<timeval>_>::reset
            ((__uniq_ptr_impl<timeval,_std::default_delete<timeval>_> *)&this->_read_time,__p);
  ptVar1 = (this->_read_time)._M_t.super___uniq_ptr_impl<timeval,_std::default_delete<timeval>_>.
           _M_t.super__Tuple_impl<0UL,_timeval_*,_std::default_delete<timeval>_>.
           super__Head_base<0UL,_timeval_*,_false>._M_head_impl;
  ptVar1->tv_sec = 1;
  ptVar1->tv_usec = 0;
  __p_00 = (pointer)operator_new(0x80);
  std::__uniq_ptr_impl<fd_set,_std::default_delete<fd_set>_>::reset
            ((__uniq_ptr_impl<fd_set,_std::default_delete<fd_set>_> *)&this->_readset,__p_00);
  __p_01 = (pointer)operator_new(0x10);
  std::__uniq_ptr_impl<sockaddr_in,_std::default_delete<sockaddr_in>_>::reset
            ((__uniq_ptr_impl<sockaddr_in,_std::default_delete<sockaddr_in>_> *)&this->_read_addr,
             __p_01);
  return;
}

Assistant:

UdpSocket::UdpSocket(uint16_t port)
	: _port(port)
{
	InitSocket();
	_read_time.reset(new timeval);
	_read_time->tv_sec = 1;
	_read_time->tv_usec = 0;
	_readset.reset(new fd_set);
	_read_addr.reset(new sockaddr_in);
}